

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cont_mgau.c
# Opt level: O1

int32 mgau_eval(mgau_model_t *g,int32 m,int32 *active,float32 *x,int32 fr,int32 update_best_id)

{
  uint veclen;
  logmath_t *lmath;
  int logb_x;
  mgau_t *mgau;
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int32 iVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  float64 fVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  float64 f;
  
  if (g->comp_type != 0x4e23) {
    __assert_fail("g->comp_type == MIX_INT_FLOAT_COMP",
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/cont_mgau.c"
                  ,0x4a1,"int32 mgau_eval(mgau_model_t *, int32, int32 *, float32 *, int32, int32)")
    ;
  }
  veclen = g->veclen;
  uVar8 = (ulong)veclen;
  mgau = g->mgau + m;
  if (update_best_id != 0) {
    mgau->bstidx = -1;
    mgau->bstscr = -0x38000000;
    mgau->updatetime = fr;
  }
  dVar13 = (double)g->distfloor;
  lmath = g->logmath;
  fVar9 = logmath_get_base(lmath);
  dVar10 = log((double)fVar9);
  dVar10 = 1.0 / dVar10;
  if (active == (int32 *)0x0) {
    iVar3 = mgau->n_comp;
    if (iVar3 < 2) {
      uVar1 = 0;
      logb_x = -0x38000000;
    }
    else {
      logb_x = -0x38000000;
      uVar1 = 0;
      do {
        uVar6 = (uint)uVar1;
        if (mgau->fullvar == (float32 ***)0x0) {
          fVar9 = (float64)(double)(float)mgau->lrd[uVar1];
          dVar11 = (double)(float)mgau->lrd[uVar1 + 1];
          if (0 < (int)veclen) {
            uVar2 = 0;
            do {
              dVar12 = (double)((float)x[uVar2] - (float)mgau->mean[uVar1][uVar2]);
              fVar9 = (float64)((double)fVar9 -
                               dVar12 * dVar12 * (double)(float)mgau->var[uVar1][uVar2]);
              dVar12 = (double)((float)x[uVar2] - (float)mgau->mean[uVar1 + 1][uVar2]);
              dVar11 = dVar11 - dVar12 * dVar12 * (double)(float)mgau->var[uVar1 + 1][uVar2];
              uVar2 = uVar2 + 1;
            } while (uVar8 != uVar2);
          }
        }
        else {
          fVar9 = mgau_density_full(mgau,veclen,uVar6,x);
          dVar11 = (double)mgau_density_full(mgau,veclen,uVar6 | 1,x);
        }
        dVar12 = dVar13;
        if (dVar13 <= (double)fVar9) {
          dVar12 = (double)fVar9;
        }
        iVar7 = (int)(dVar12 * dVar10) + mgau->mixw[uVar1];
        iVar3 = logmath_add(lmath,logb_x,iVar7);
        if (mgau->bstscr < iVar7) {
          mgau->bstidx = uVar6;
          mgau->bstscr = iVar7;
        }
        dVar12 = dVar13;
        if (dVar13 <= dVar11) {
          dVar12 = dVar11;
        }
        iVar7 = (int)(dVar12 * dVar10) + mgau->mixw[uVar1 + 1];
        logb_x = logmath_add(lmath,iVar3,iVar7);
        if ((update_best_id != 0) && (mgau->bstscr < iVar7)) {
          mgau->bstidx = uVar6 | 1;
          mgau->bstscr = iVar7;
        }
        uVar1 = uVar1 + 2;
        iVar3 = mgau->n_comp;
      } while ((long)uVar1 < (long)iVar3 + -1);
    }
    iVar4 = (int32)uVar1;
    if (iVar4 < iVar3) {
      uVar1 = uVar1 & 0xffffffff;
      if (mgau->fullvar == (float32 ***)0x0) {
        dVar11 = (double)(float)mgau->lrd[uVar1];
        if (0 < (int)veclen) {
          uVar2 = 0;
          do {
            dVar12 = (double)((float)x[uVar2] - (float)mgau->mean[uVar1][uVar2]);
            dVar11 = dVar11 - dVar12 * dVar12 * (double)(float)mgau->var[uVar1][uVar2];
            uVar2 = uVar2 + 1;
          } while (uVar8 != uVar2);
        }
      }
      else {
        dVar11 = (double)mgau_density_full(mgau,veclen,iVar4,x);
      }
      if (dVar13 <= dVar11) {
        dVar13 = dVar11;
      }
      iVar3 = (int)(dVar10 * dVar13) + mgau->mixw[uVar1];
      logb_x = logmath_add(lmath,logb_x,iVar3);
      if ((update_best_id != 0) && (mgau->bstscr < iVar3)) {
        mgau->bstidx = iVar4;
        mgau->bstscr = iVar3;
      }
    }
  }
  else {
    uVar6 = *active;
    logb_x = -0x38000000;
    if (-1 < (int)uVar6) {
      lVar5 = 0;
      do {
        if (mgau->fullvar == (float32 ***)0x0) {
          fVar9 = (float64)(double)(float)mgau->lrd[uVar6];
          if (0 < (int)veclen) {
            uVar1 = 0;
            do {
              dVar11 = (double)((float)x[uVar1] - (float)mgau->mean[uVar6][uVar1]);
              fVar9 = (float64)((double)fVar9 -
                               dVar11 * dVar11 * (double)(float)mgau->var[uVar6][uVar1]);
              uVar1 = uVar1 + 1;
            } while (uVar8 != uVar1);
          }
          if ((double)fVar9 < dVar13) {
            fVar9 = (float64)dVar13;
          }
        }
        else {
          fVar9 = mgau_density_full(mgau,veclen,uVar6,x);
        }
        iVar3 = (int)((double)fVar9 * dVar10) + mgau->mixw[uVar6];
        logb_x = logmath_add(lmath,logb_x,iVar3);
        if ((update_best_id != 0) && (mgau->bstscr < iVar3)) {
          mgau->bstidx = uVar6;
          mgau->bstscr = iVar3;
        }
        uVar6 = active[lVar5 + 1];
        lVar5 = lVar5 + 1;
      } while (-1 < (int)uVar6);
    }
  }
  iVar4 = -0x38000000;
  if (-0x38000000 < logb_x) {
    iVar4 = logb_x;
  }
  return iVar4;
}

Assistant:

int32
mgau_eval(mgau_model_t * g, int32 m, int32 * active, float32 * x, int32 fr,
          int32 update_best_id)
{
    mgau_t *mgau;
    int32 veclen, score;

    veclen = mgau_veclen(g);
    mgau = &(g->mgau[m]);
    assert(g->comp_type == MIX_INT_FLOAT_COMP);

    if (update_best_id) {
        mgau->bstidx = NO_BSTIDX;
        mgau->bstscr = S3_LOGPROB_ZERO;
        mgau->updatetime = fr;
    }

    if (!active) {              /* No short list; use all */
        score =
            mgau_eval_all(mgau, x, veclen, g->distfloor, update_best_id, g->logmath);
    }
    else {
        score =
            mgau_eval_active(mgau, x, veclen, g->distfloor, active,
                             update_best_id, g->logmath);
    }

    if (score <= S3_LOGPROB_ZERO) {
        /*      E_INFO("Warning!! Score is S3_LOGPROB_ZERO\n"); */
        score = S3_LOGPROB_ZERO;
    }
    return score;
}